

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O3

int __thiscall QBuffer::open(QBuffer *this,char *__file,int __oflag,...)

{
  int iVar1;
  int extraout_EDX;
  ulong uVar2;
  
  uVar2 = (ulong)((uint)__file | 2);
  if (((ulong)__file & 0xc) == 0) {
    uVar2 = (ulong)__file & 0xffffffff;
  }
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 8) != 0) {
      QByteArray::resize((QByteArray *)
                         (this->super_QIODevice).super_QObject.d_ptr.d[4].bindingStorage.
                         bindingStatus,0);
      __oflag = extraout_EDX;
    }
    iVar1 = QIODevice::open(&this->super_QIODevice,(char *)(ulong)((uint)uVar2 | 0x20),__oflag);
    return iVar1;
  }
  open((char *)this,(uint)__file);
  return 0;
}

Assistant:

bool QBuffer::open(OpenMode mode)
{
    Q_D(QBuffer);

    if ((mode & (Append | Truncate)) != 0)
        mode |= WriteOnly;
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QBuffer::open: Buffer access not specified");
        return false;
    }

    if ((mode & Truncate) == Truncate)
        d->buf->resize(0);

    return QIODevice::open(mode | QIODevice::Unbuffered);
}